

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  double dVar1;
  int iVar2;
  int iVar3;
  UserData pUVar4;
  N_Vector y;
  undefined8 *puVar5;
  N_Vector e;
  void *pvVar6;
  void *returnvalue;
  FILE *YFID;
  uint uVar7;
  ulong uVar8;
  int retval;
  UserData local_d0;
  double local_c8;
  void *local_c0;
  SUNContext sunctx;
  sunrealtype t;
  void *local_a8;
  sunrealtype ec;
  double local_98;
  FILE *local_90;
  FILE *local_88;
  int local_7c;
  ulong local_78;
  undefined8 local_70;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst;
  int retval_1;
  long nje;
  
  t = 0.0;
  ec = 0.0;
  sunctx = (SUNContext)0x0;
  retval = SUNContext_Create(0);
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 != 0) {
    return 1;
  }
  pUVar4 = (UserData)malloc(0x38);
  iVar2 = check_retval(pUVar4,"malloc",0);
  if (iVar2 != 0) {
    return 1;
  }
  pUVar4->alpha = 1.0;
  pUVar4->orbits = 100;
  pUVar4->torbit = 6.283185307179586;
  pUVar4->rtol = 0.0001;
  pUVar4->atol = 1e-09;
  pUVar4->proj = 1;
  pUVar4->projerr = 0;
  pUVar4->tstop = 0;
  pUVar4->nout = 0;
  local_c0._0_4_ = 1;
  local_d0 = pUVar4;
  iVar2 = 1;
  while (iVar2 < argc) {
    __s1 = argv[iVar2];
    iVar3 = strcmp(__s1,"--alpha");
    if (iVar3 == 0) {
      dVar1 = atof(argv[(long)iVar2 + 1]);
      local_d0->alpha = dVar1;
      local_d0->torbit = 6.283185307179586 / dVar1;
      iVar2 = iVar2 + 2;
    }
    else {
      iVar3 = strcmp(__s1,"--orbits");
      if (iVar3 == 0) {
        iVar3 = atoi(argv[(long)iVar2 + 1]);
        local_d0->orbits = iVar3;
        iVar2 = iVar2 + 2;
      }
      else {
        iVar3 = strcmp(__s1,"--rtol");
        if (iVar3 == 0) {
          dVar1 = atof(argv[(long)iVar2 + 1]);
          local_d0->rtol = dVar1;
          iVar2 = iVar2 + 2;
        }
        else {
          iVar3 = strcmp(__s1,"--atol");
          if (iVar3 == 0) {
            dVar1 = atof(argv[(long)iVar2 + 1]);
            local_d0->atol = dVar1;
            iVar2 = iVar2 + 2;
          }
          else {
            iVar3 = strcmp(__s1,"--proj");
            if (iVar3 == 0) {
              local_c0._0_4_ = atoi(argv[(long)iVar2 + 1]);
              local_d0->proj = (int)local_c0;
              iVar2 = iVar2 + 2;
            }
            else {
              iVar3 = strcmp(__s1,"--projerr");
              if (iVar3 == 0) {
                iVar3 = atoi(argv[(long)iVar2 + 1]);
                local_d0->projerr = iVar3;
                iVar2 = iVar2 + 2;
              }
              else {
                iVar3 = strcmp(__s1,"--nout");
                if (iVar3 == 0) {
                  iVar3 = atoi(argv[(long)iVar2 + 1]);
                  local_d0->nout = iVar3;
                  iVar2 = iVar2 + 2;
                }
                else {
                  iVar3 = strcmp(__s1,"--tstop");
                  if (iVar3 != 0) {
                    iVar3 = strcmp(__s1,"--help");
                    iVar2 = -1;
                    if (iVar3 != 0) {
                      fprintf(_stderr,"ERROR: Invalid input %s",__s1);
                    }
                    InputHelp();
                    goto LAB_0010266b;
                  }
                  local_d0->tstop = 1;
                  iVar2 = iVar2 + 1;
                }
              }
            }
          }
        }
      }
    }
  }
  iVar2 = 0;
  if ((int)local_c0 == 0) {
    local_d0->projerr = 0;
  }
LAB_0010266b:
  retval = iVar2;
  iVar2 = check_retval(&retval,"InitUserData",1);
  if (iVar2 != 0) {
    return 1;
  }
  y = (N_Vector)N_VNew_Serial(2,sunctx);
  iVar2 = check_retval(y,"N_VNew_Serial",0);
  if (iVar2 != 0) {
    return 1;
  }
  puVar5 = (undefined8 *)N_VGetArrayPointer(y);
  *puVar5 = 0x3ff0000000000000;
  puVar5[1] = 0;
  e = (N_Vector)N_VClone(y);
  iVar2 = check_retval(y,"N_VClone",0);
  if (iVar2 != 0) {
    return 1;
  }
  N_VConst(0,e);
  pvVar6 = (void *)CVodeCreate(2,sunctx);
  local_a8 = pvVar6;
  iVar2 = check_retval(pvVar6,"CVodeCreate",0);
  pUVar4 = local_d0;
  if (iVar2 != 0) {
    return 1;
  }
  retval = CVodeInit(0,pvVar6,f,y);
  iVar2 = check_retval(&retval,"CVodeInit",1);
  if (iVar2 != 0) {
    return 1;
  }
  retval = CVodeSetUserData(pvVar6,pUVar4);
  iVar2 = check_retval(&retval,"CVodeSetUserData",1);
  if (iVar2 != 0) {
    return 1;
  }
  retval = CVodeSStolerances(SUB84(pUVar4->rtol,0),pvVar6);
  iVar2 = check_retval(&retval,"CVodeSStolerances",1);
  if (iVar2 != 0) {
    return 1;
  }
  returnvalue = (void *)SUNDenseMatrix(2,2,sunctx);
  iVar2 = check_retval(returnvalue,"SUNDenseMatrix",0);
  if (iVar2 != 0) {
    return 1;
  }
  local_c0 = (void *)SUNLinSol_Dense(y,returnvalue,sunctx);
  iVar2 = check_retval(local_c0,"SUNLinSol_Dense",0);
  if (iVar2 != 0) {
    return 1;
  }
  retval = CVodeSetLinearSolver(pvVar6,local_c0,returnvalue);
  iVar2 = check_retval(&retval,"CVodeSetLinearSolver",1);
  if (iVar2 != 0) {
    return 1;
  }
  retval = CVodeSetJacFn(pvVar6,Jac);
  iVar2 = check_retval(&retval,"CVodeSetJacFn",1);
  if (iVar2 != 0) {
    return 1;
  }
  if (pUVar4->proj != 0) {
    retval = CVodeSetProjFn(pvVar6,Proj);
    iVar2 = check_retval(&retval,"CVodeSetProjFn",1);
    if (iVar2 != 0) {
      return 1;
    }
    retval = CVodeSetProjErrEst(pvVar6,pUVar4->projerr);
    iVar2 = check_retval(&retval,"CVodeSetProjErrEst",1);
    if (iVar2 != 0) {
      return 1;
    }
  }
  retval = CVodeSetMaxNumSteps(pvVar6,100000);
  iVar2 = check_retval(&retval,"CVodeSetMaxNumSteps",1);
  if (iVar2 != 0) {
    return 1;
  }
  puts("\nParticle traveling on the unit circle example");
  puts("---------------------------------------------");
  printf("alpha      = %0.4e\n",SUB84(pUVar4->alpha,0));
  printf("num orbits = %d\n",(ulong)(uint)pUVar4->orbits);
  puts("---------------------------------------------");
  printf("rtol       = %g\n",SUB84(pUVar4->rtol,0));
  printf("atol       = %g\n",SUB84(pUVar4->atol,0));
  printf("proj sol   = %d\n",(ulong)(uint)pUVar4->proj);
  printf("proj err   = %d\n",(ulong)(uint)pUVar4->projerr);
  printf("nout       = %d\n",(ulong)(uint)pUVar4->nout);
  printf("tstop      = %d\n",(ulong)(uint)pUVar4->tstop);
  puts("---------------------------------------------");
  retval = 0;
  iVar2 = check_retval(&retval,"PrintUserData",1);
  if (iVar2 != 0) {
    return 1;
  }
  local_88 = (FILE *)0x0;
  printf("\n     t            x              y");
  puts("             err x          err y       err constr");
  WriteOutput(0.0,y,e,0.0,0,(FILE *)0x0,(FILE *)0x0);
  local_90 = (FILE *)0x0;
  if (0 < pUVar4->nout) {
    YFID = fopen("cvsParticle_solution.txt","w");
    local_88 = fopen("cvsParticle_error.txt","w");
    local_90 = YFID;
    WriteOutput(0.0,y,e,0.0,1,(FILE *)YFID,(FILE *)local_88);
    iVar2 = local_d0->nout;
    if (0 < iVar2) {
      uVar7 = iVar2 * local_d0->orbits;
      local_98 = local_d0->torbit / (double)iVar2;
      goto LAB_00102aff;
    }
  }
  local_98 = (double)local_d0->orbits * local_d0->torbit;
  uVar7 = 1;
LAB_00102aff:
  local_7c = uVar7 - 1;
  uVar8 = 0;
  local_78 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    local_78 = uVar8;
  }
  local_c8 = local_98;
  while( true ) {
    pvVar6 = local_a8;
    iVar2 = (int)uVar8;
    if ((int)local_78 == iVar2) break;
    if ((local_d0->tstop != 0) || (local_d0->nout == 0)) {
      retval = CVodeSetStopTime(SUB84(local_c8,0),local_a8);
      iVar3 = check_retval(&retval,"CVodeSetStopTime",1);
      if (iVar3 != 0) {
        return 1;
      }
    }
    retval = CVode(SUB84(local_c8,0),pvVar6,y,&t,1);
    iVar3 = check_retval(&retval,"CVode",1);
    if (iVar3 != 0) break;
    if (0 < local_d0->nout) {
      retval = ComputeError(t,y,e,&ec,local_d0);
      iVar3 = check_retval(&retval,"ComputeError",1);
      if (iVar3 != 0) break;
      WriteOutput(t,y,e,ec,1,(FILE *)local_90,(FILE *)local_88);
      iVar3 = check_retval(&retval,"WriteOutput",1);
      if (iVar3 != 0) break;
    }
    if (iVar2 < local_7c) {
      local_c8 = local_c8 + local_98;
    }
    else {
      local_c8 = (double)local_d0->orbits * local_d0->torbit;
    }
    uVar8 = (ulong)(iVar2 + 1);
  }
  if (0 < local_d0->nout) {
    fclose(local_90);
    fclose(local_88);
  }
  pUVar4 = local_d0;
  ComputeError(t,y,e,&ec,local_d0);
  iVar3 = 1;
  iVar2 = check_retval(&retval,"ComputeError",1);
  if (iVar2 == 0) {
    WriteOutput(t,y,e,ec,0,(FILE *)0x0,(FILE *)0x0);
    iVar3 = 1;
    iVar2 = check_retval(&retval,"WriteOutput",1);
    pvVar6 = local_a8;
    if (iVar2 == 0) {
      retval_1 = CVodeGetNumSteps(local_a8,&nst);
      check_retval(&retval_1,"CVodeGetNumSteps",1);
      retval_1 = CVodeGetNumRhsEvals(pvVar6,&nfe);
      check_retval(&retval_1,"CVodeGetNumRhsEvals",1);
      retval_1 = CVodeGetNumLinSolvSetups(pvVar6,&nsetups);
      check_retval(&retval_1,"CVodeGetNumLinSolvSetups",1);
      retval_1 = CVodeGetNumErrTestFails(pvVar6,&local_70);
      check_retval(&retval_1,"CVodeGetNumErrTestFails",1);
      retval_1 = CVodeGetNumNonlinSolvIters(pvVar6,&nni);
      check_retval(&retval_1,"CVodeGetNumNonlinSolvIters",1);
      retval_1 = CVodeGetNumNonlinSolvConvFails(pvVar6,&ncfn);
      check_retval(&retval_1,"CVodeGetNumNonlinSolvConvFails",1);
      retval_1 = CVodeGetNumJacEvals(pvVar6);
      check_retval(&retval_1,"CVodeGetNumJacEvals",1);
      puts("\nIntegration Statistics:");
      printf("Number of steps taken = %-6ld\n",nst);
      printf("Number of function evaluations = %-6ld\n",nfe);
      printf("Number of linear solver setups = %-6ld\n",nsetups);
      printf("Number of Jacobian evaluations = %-6ld\n",nje);
      printf("Number of nonlinear solver iterations = %-6ld\n",nni);
      printf("Number of convergence failures = %-6ld\n",ncfn);
      printf("Number of error test failures = %-6ld\n",local_70);
      free(pUVar4);
      N_VDestroy(y);
      N_VDestroy(e);
      SUNMatDestroy(returnvalue);
      SUNLinSolFree(local_c0);
      CVodeFree(&local_a8);
      SUNContext_Free(&sunctx);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int main(int argc, char* argv[])
{
  int retval;               /* reusable return flag       */
  int out           = 0;    /* output counter             */
  int totalout      = 0;    /* output counter             */
  sunrealtype t     = ZERO; /* current integration time   */
  sunrealtype dtout = ZERO; /* output spacing             */
  sunrealtype tout  = ZERO; /* next output time           */
  sunrealtype ec    = ZERO; /* constraint error           */
  UserData udata    = NULL; /* user data structure        */

  SUNContext sunctx  = NULL; /* SUNDIALS context     */
  void* cvode_mem    = NULL; /* CVODES memory        */
  N_Vector y         = NULL; /* solution vector      */
  sunrealtype* ydata = NULL; /* solution vector data */
  N_Vector e         = NULL; /* error vector         */
  SUNMatrix A        = NULL; /* Jacobian matrix      */
  SUNLinearSolver LS = NULL; /* linear solver        */

  FILE* YFID = NULL; /* solution output file */
  FILE* EFID = NULL; /* error output file    */

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize user data structure */
  udata = (UserData)malloc(sizeof *udata);
  if (check_retval((void*)udata, "malloc", 0)) { return (1); }

  retval = InitUserData(&argc, &argv, udata);
  if (check_retval(&retval, "InitUserData", 1)) { return (1); }

  /* Create serial vector to store the solution */
  y = N_VNew_Serial(2, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Set initial contion */
  ydata    = N_VGetArrayPointer(y);
  ydata[0] = ONE;
  ydata[1] = ZERO;

  /* Create serial vector to store the solution error */
  e = N_VClone(y);
  if (check_retval((void*)y, "N_VClone", 0)) { return (1); }

  /* Set initial error */
  N_VConst(ZERO, e);

  /* Create CVODES memory */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Initialize CVODES */
  retval = CVodeInit(cvode_mem, f, t, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Attach user-defined data structure to CVODES */
  retval = CVodeSetUserData(cvode_mem, udata);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Set integration tolerances */
  retval = CVodeSStolerances(cvode_mem, udata->rtol, udata->atol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(2, 2, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to CVODES */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set a user-supplied Jacobian function */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Set a user-supplied projection function */
  if (udata->proj)
  {
    retval = CVodeSetProjFn(cvode_mem, Proj);
    if (check_retval(&retval, "CVodeSetProjFn", 1)) { return (1); }

    retval = CVodeSetProjErrEst(cvode_mem, udata->projerr);
    if (check_retval(&retval, "CVodeSetProjErrEst", 1)) { return (1); }
  }

  /* Set max steps between outputs */
  retval = CVodeSetMaxNumSteps(cvode_mem, 100000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Output problem setup */
  retval = PrintUserData(udata);
  if (check_retval(&retval, "PrintUserData", 1)) { return (1); }

  /* Output initial condition */
  printf("\n     t            x              y");
  printf("             err x          err y       err constr\n");
  WriteOutput(t, y, e, ec, 0, NULL, NULL);

  if (udata->nout > 0)
  {
    YFID = fopen("cvsParticle_solution.txt", "w");
    EFID = fopen("cvsParticle_error.txt", "w");
    WriteOutput(t, y, e, ec, 1, YFID, EFID);
  }

  /* Integrate in time and periodically output the solution and error */
  if (udata->nout > 0)
  {
    totalout = udata->orbits * udata->nout;
    dtout    = udata->torbit / udata->nout;
  }
  else
  {
    totalout = 1;
    dtout    = udata->torbit * udata->orbits;
  }
  tout = dtout;

  for (out = 0; out < totalout; out++)
  {
    /* Stop at output time (do not interpolate output) */
    if (udata->tstop || udata->nout == 0)
    {
      retval = CVodeSetStopTime(cvode_mem, tout);
      if (check_retval(&retval, "CVodeSetStopTime", 1)) { return (1); }
    }

    /* Advance in time */
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }

    /* Output solution and error */
    if (udata->nout > 0)
    {
      retval = ComputeError(t, y, e, &ec, udata);
      if (check_retval(&retval, "ComputeError", 1)) { break; }

      WriteOutput(t, y, e, ec, 1, YFID, EFID);
      if (check_retval(&retval, "WriteOutput", 1)) { break; }
    }

    /* Update output time */
    if (out < totalout - 1) { tout += dtout; }
    else { tout = udata->torbit * udata->orbits; }
  }

  /* Close output files */
  if (udata->nout > 0)
  {
    fclose(YFID);
    fclose(EFID);
  }

  /* Output final solution and error to screen */
  ComputeError(t, y, e, &ec, udata);
  if (check_retval(&retval, "ComputeError", 1)) { return (1); }

  WriteOutput(t, y, e, ec, 0, NULL, NULL);
  if (check_retval(&retval, "WriteOutput", 1)) { return (1); }

  /* Print some final statistics */
  PrintStats(cvode_mem);

  /* Free memory */
  free(udata);
  N_VDestroy(y);
  N_VDestroy(e);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);
  SUNContext_Free(&sunctx);

  return (0);
}